

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebug::putString(QDebug *this,QChar *begin,size_t length)

{
  QDebug *in_RDX;
  QDebugStateSaver *in_RSI;
  Params *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *unaff_retaddr;
  QDebugStateSaver saver;
  Params *pPVar1;
  undefined1 isUnicode;
  QTextStreamPrivate *in_stack_fffffffffffffff0;
  undefined1 *length_00;
  char16_t *begin_00;
  
  begin_00 = *(char16_t **)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)in_RDI + 0x31) & 1) == 0) {
    length_00 = &DAT_aaaaaaaaaaaaaaaa;
    pPVar1 = in_RDI;
    QDebugStateSaver::QDebugStateSaver(in_RSI,in_RDX);
    isUnicode = (undefined1)((ulong)pPVar1 >> 0x38);
    std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::operator->
              ((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)0x277901)
    ;
    QTextStreamPrivate::Params::reset(in_RDI);
    std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::get
              ((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)in_RDI);
    putEscapedString<char16_t>(unaff_retaddr,begin_00,(size_t)length_00,(bool)isUnicode);
    QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_RDI);
  }
  else {
    std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::operator->
              ((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)0x2778b9)
    ;
    QTextStreamPrivate::putString
              (in_stack_fffffffffffffff0,(QChar *)in_RDI,(qsizetype)in_RSI,
               SUB81((ulong)in_RDX >> 0x38,0));
  }
  if (*(char16_t **)(in_FS_OFFSET + 0x28) == begin_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putString(const QChar *begin, size_t length)
{
    if (stream->noQuotes) {
        // no quotes, write the string directly too (no pretty-printing)
        // this respects the QTextStream state, though
        stream->ts.d_ptr->putString(begin, qsizetype(length));
    } else {
        // we'll reset the QTextStream formatting mechanisms, so save the state
        QDebugStateSaver saver(*this);
        stream->ts.d_ptr->params.reset();
        putEscapedString(stream->ts.d_ptr.get(), reinterpret_cast<const char16_t *>(begin), length);
    }
}